

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::createTiles(Fifteen *this)

{
  unique_ptr<Board,_std::default_delete<Board>_> local_20;
  unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_> local_18;
  
  Controller::getBoardAttributes((Controller *)&local_20);
  TilesBoard::createTiles
            ((this->tilesBoard)._M_t.
             super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
             super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
             super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl,
             (size_t)local_18._M_t.
                     super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                     super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                     super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl,
             (size_t)local_20._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                     super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                     super__Head_base<0UL,_Board_*,_false>._M_head_impl,&this->super_QMainWindow);
  return;
}

Assistant:

void Fifteen::createTiles()
{
    auto [ boardSize, tileSize ] = controller->getBoardAttributes();
    tilesBoard->createTiles( boardSize, tileSize, this );
}